

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.cpp
# Opt level: O2

void __thiscall lsh::table::erase(table *this,vector *v)

{
  uint uVar1;
  pointer puVar2;
  pointer puVar3;
  bool bVar4;
  uint in_EAX;
  uint uVar5;
  invalid_argument *this_00;
  const_iterator __position;
  __node_base *p_Var6;
  __node_base *p_Var7;
  ulong uVar8;
  uint uStack_38;
  uint u;
  
  uVar1 = this->dimensions_;
  uStack_38 = in_EAX;
  uVar5 = lsh::vector::size(v);
  if (uVar1 != uVar5) {
    this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument(this_00,"Invalid vector size");
    __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  puVar2 = (this->partitions_).
           super__Vector_base<std::unordered_map<unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>,_std::allocator<std::unordered_map<unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  puVar3 = (this->partitions_).
           super__Vector_base<std::unordered_map<unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>,_std::allocator<std::unordered_map<unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  _uStack_38 = (ulong)uStack_38;
  p_Var7 = &(this->vectors_)._M_h._M_before_begin;
  do {
    p_Var7 = p_Var7->_M_nxt;
    if (p_Var7 == (__node_base *)0x0) goto LAB_00128757;
    bVar4 = lsh::vector::operator==((vector *)(p_Var7 + 2),v);
  } while (!bVar4);
  _uStack_38 = CONCAT44((int)*(size_type *)(p_Var7 + 1),uStack_38);
LAB_00128757:
  std::
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_lsh::vector>,_std::allocator<std::pair<const_unsigned_int,_lsh::vector>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::_M_erase(&(this->vectors_)._M_h,&u);
  uVar8 = 0;
  do {
    if (uVar8 == (((long)puVar2 - (long)puVar3) / 0x38 & 0xffffffffU)) {
      return;
    }
    p_Var6 = &(this->partitions_).
              super__Vector_base<std::unordered_map<unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>,_std::allocator<std::unordered_map<unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start[uVar8]._M_h._M_before_begin;
LAB_0012877f:
    p_Var6 = p_Var6->_M_nxt;
    if (p_Var6 != (__node_base *)0x0) {
      __position._M_current = *(uint **)&((_Prime_rehash_policy *)(p_Var6 + 2))->_M_max_load_factor;
      for (; (_Hash_node_base *)__position._M_current != p_Var6[3]._M_nxt;
          __position._M_current = __position._M_current + 1) {
        if (*__position._M_current == u) {
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::erase
                    ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(p_Var6 + 2),__position)
          ;
          break;
        }
      }
      goto LAB_0012877f;
    }
    uVar8 = uVar8 + 1;
  } while( true );
}

Assistant:

void table::erase(const vector& v) {
    if (this->dimensions_ != v.size()) {
      throw std::invalid_argument("Invalid vector size");
    }

    unsigned int n = this->partitions_.size();
    unsigned int u = 0;

    for (const auto& it: this->vectors_) {
      if (it.second == v) {
        u = it.first;
        break;
      }
    }

    this->vectors_.erase(u);

    for (unsigned int i = 0; i < n; i++) {
      partition& p = this->partitions_[i];

      for (auto& it: p) {
        bucket& b = it.second;

        for (auto j = b.begin(); j != b.end(); j++) {
          if (*j == u) {
            b.erase(j);
            break;
          }
        }
      }
    }
  }